

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t read_var(archive_read *a,uint64_t *pvalue,uint64_t *pvalue_len)

{
  byte bVar1;
  wchar_t wVar2;
  void *pvVar3;
  int64_t iVar4;
  byte bVar5;
  uint64_t uVar6;
  uint64_t request;
  ssize_t avail;
  ssize_t local_28;
  
  local_28 = -1;
  pvVar3 = __archive_read_ahead(a,8,&local_28);
  if (pvVar3 == (void *)0x0) {
LAB_005cda5b:
    wVar2 = L'\0';
  }
  else {
    request = 1;
    bVar5 = 0;
    uVar6 = 0;
    do {
      bVar1 = *(byte *)((long)pvVar3 + (request - 1));
      uVar6 = ((ulong)(bVar1 & 0x7f) << (bVar5 & 0x3f)) + uVar6;
      if (-1 < (char)bVar1) {
        if (pvalue != (uint64_t *)0x0) {
          *pvalue = uVar6;
        }
        if (pvalue_len != (uint64_t *)0x0) {
          *pvalue_len = request;
          goto LAB_005cda41;
        }
        uVar6 = __archive_read_consume(a,request);
        if (uVar6 == request) goto LAB_005cda41;
        goto LAB_005cda5b;
      }
      bVar5 = bVar5 + 7;
      request = request + 1;
    } while (request != 9);
    if (pvalue != (uint64_t *)0x0) {
      *pvalue = uVar6;
    }
    if (pvalue_len == (uint64_t *)0x0) {
      iVar4 = __archive_read_consume(a,9);
      if (iVar4 != 9) goto LAB_005cda5b;
    }
    else {
      *pvalue_len = 9;
    }
LAB_005cda41:
    wVar2 = L'\x01';
  }
  return wVar2;
}

Assistant:

static int read_var(struct archive_read* a, uint64_t* pvalue,
    uint64_t* pvalue_len)
{
	uint64_t result = 0;
	size_t shift, i;
	const uint8_t* p;
	uint8_t b;

	/* We will read maximum of 8 bytes. We don't have to handle the
	 * situation to read the RAR5 variable-sized value stored at the end of
	 * the file, because such situation will never happen. */
	if(!read_ahead(a, 8, &p))
		return 0;

	for(shift = 0, i = 0; i < 8; i++, shift += 7) {
		b = p[i];

		/* Strip the MSB from the input byte and add the resulting
		 * number to the `result`. */
		result += (b & (uint64_t)0x7F) << shift;

		/* MSB set to 1 means we need to continue decoding process.
		 * MSB set to 0 means we're done.
		 *
		 * This conditional checks for the second case. */
		if((b & 0x80) == 0) {
			if(pvalue) {
				*pvalue = result;
			}

			/* If the caller has passed the `pvalue_len` pointer,
			 * store the number of consumed bytes in it and do NOT
			 * consume those bytes, since the caller has all the
			 * information it needs to perform */
			if(pvalue_len) {
				*pvalue_len = 1 + i;
			} else {
				/* If the caller did not provide the
				 * `pvalue_len` pointer, it will not have the
				 * possibility to advance the file pointer,
				 * because it will not know how many bytes it
				 * needs to consume. This is why we handle
				 * such situation here automatically. */
				if(ARCHIVE_OK != consume(a, 1 + i)) {
					return 0;
				}
			}

			/* End of decoding process, return success. */
			return 1;
		}
	}

	/* The decoded value takes the maximum number of 8 bytes.
	 * It's a maximum number of bytes, so end decoding process here
	 * even if the first bit of last byte is 1. */
	if(pvalue) {
		*pvalue = result;
	}

	if(pvalue_len) {
		*pvalue_len = 9;
	} else {
		if(ARCHIVE_OK != consume(a, 9)) {
			return 0;
		}
	}

	return 1;
}